

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O2

void xfer_setup(Curl_easy *data,int sockindex,curl_off_t size,_Bool getheader,int writesockindex,
               _Bool shutdown)

{
  int *piVar1;
  connectdata *pcVar2;
  _Bool _Var3;
  curl_socket_t cVar4;
  uint uVar5;
  uint uVar6;
  curl_socket_t cVar7;
  
  pcVar2 = data->conn;
  _Var3 = Curl_req_want_send(data);
  if ((((pcVar2->bits).field_0x2 & 0x40) != 0) || (0x13 < pcVar2->httpversion || _Var3)) {
    uVar6 = sockindex;
    if ((sockindex == -1) && (uVar6 = writesockindex, writesockindex == -1)) {
      cVar7 = -1;
    }
    else {
      cVar7 = pcVar2->sock[uVar6];
    }
    pcVar2->sockfd = cVar7;
    pcVar2->writesockfd = cVar7;
    if (_Var3) {
      writesockindex = 0;
    }
  }
  else {
    cVar4 = -1;
    cVar7 = cVar4;
    if (sockindex != -1) {
      cVar7 = pcVar2->sock[(uint)sockindex];
    }
    pcVar2->sockfd = cVar7;
    if (writesockindex != -1) {
      cVar4 = pcVar2->sock[(uint)writesockindex];
    }
    pcVar2->writesockfd = cVar4;
  }
  uVar6 = *(uint *)&(data->req).field_0xd9;
  (data->req).size = size;
  uVar5 = (uint)shutdown << 0x14 | uVar6 & 0xffeeffff | (uint)getheader << 0x10;
  *(uint *)&(data->req).field_0xd9 = uVar5;
  if (!getheader) {
    uVar5 = (uint)shutdown << 0x14 | uVar6 & 0xffeefffe | (uint)getheader << 0x10;
    *(uint *)&(data->req).field_0xd9 = uVar5;
    if (0 < size) {
      Curl_pgrsSetDownloadSize(data,size);
      uVar5 = *(uint *)&(data->req).field_0xd9;
    }
  }
  if ((uVar5 & 0x30000) != 0x20000) {
    if (sockindex != -1) {
      piVar1 = &(data->req).keepon;
      *(byte *)piVar1 = (byte)*piVar1 | 1;
    }
    if (writesockindex != -1) {
      piVar1 = &(data->req).keepon;
      *(byte *)piVar1 = (byte)*piVar1 | 2;
    }
  }
  return;
}

Assistant:

static void xfer_setup(
  struct Curl_easy *data,   /* transfer */
  int sockindex,            /* socket index to read from or -1 */
  curl_off_t size,          /* -1 if unknown at this point */
  bool getheader,           /* TRUE if header parsing is wanted */
  int writesockindex,       /* socket index to write to, it may very well be
                               the same we read from. -1 disables */
  bool shutdown             /* shutdown connection at transfer end. Only
                             * supported when sending OR receiving. */
  )
{
  struct SingleRequest *k = &data->req;
  struct connectdata *conn = data->conn;
  bool want_send = Curl_req_want_send(data);

  DEBUGASSERT(conn != NULL);
  DEBUGASSERT((sockindex <= 1) && (sockindex >= -1));
  DEBUGASSERT((writesockindex <= 1) && (writesockindex >= -1));
  DEBUGASSERT(!shutdown || (sockindex == -1) || (writesockindex == -1));

  if(conn->bits.multiplex || conn->httpversion >= 20 || want_send) {
    /* when multiplexing, the read/write sockets need to be the same! */
    conn->sockfd = sockindex == -1 ?
      ((writesockindex == -1 ? CURL_SOCKET_BAD : conn->sock[writesockindex])) :
      conn->sock[sockindex];
    conn->writesockfd = conn->sockfd;
    if(want_send)
      /* special and very HTTP-specific */
      writesockindex = FIRSTSOCKET;
  }
  else {
    conn->sockfd = sockindex == -1 ?
      CURL_SOCKET_BAD : conn->sock[sockindex];
    conn->writesockfd = writesockindex == -1 ?
      CURL_SOCKET_BAD:conn->sock[writesockindex];
  }

  k->getheader = getheader;
  k->size = size;
  k->shutdown = shutdown;

  /* The code sequence below is placed in this function just because all
     necessary input is not always known in do_complete() as this function may
     be called after that */

  if(!k->getheader) {
    k->header = FALSE;
    if(size > 0)
      Curl_pgrsSetDownloadSize(data, size);
  }
  /* we want header and/or body, if neither then do not do this! */
  if(k->getheader || !data->req.no_body) {

    if(sockindex != -1)
      k->keepon |= KEEP_RECV;

    if(writesockindex != -1)
      k->keepon |= KEEP_SEND;
  } /* if(k->getheader || !data->req.no_body) */

}